

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O1

bool __thiscall version_struct::operator>=(version_struct *this,char *v_str)

{
  bool bVar1;
  version_struct v_tmp;
  int local_24;
  int local_20;
  int local_1c;
  
  bVar1 = false;
  __isoc99_sscanf(v_str,"%d.%d.%d",&local_24,&local_20,&local_1c);
  if ((local_24 <= this->major) && (bVar1 = true, this->major <= local_24)) {
    if (this->minor < local_20) {
      bVar1 = false;
    }
    else if (this->minor <= local_20) {
      bVar1 = local_1c <= this->rev;
    }
  }
  return bVar1;
}

Assistant:

bool operator>=(const char* v_str)
  {
    version_struct v_tmp(v_str);
    return (*this >= v_tmp);
  }